

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Aig_Obj_t * driverToPoNew(Aig_Man_t *pAig,Aig_Obj_t *pObjPo)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_38;
  Aig_Obj_t *poDriverNew;
  Aig_Obj_t *poDriverOld;
  Aig_Obj_t *pObjPo_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsCo(pObjPo);
  if (iVar1 == 0) {
    __assert_fail("Aig_ObjIsCo(pObjPo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/arenaViolation.c"
                  ,0x72,"Aig_Obj_t *driverToPoNew(Aig_Man_t *, Aig_Obj_t *)");
  }
  pAVar2 = Aig_ObjFanin0(pObjPo);
  iVar1 = Aig_ObjFaninC0(pObjPo);
  pAVar2 = Aig_NotCond(pAVar2,iVar1);
  iVar1 = Aig_ObjIsCo(pAVar2);
  if (iVar1 == 0) {
    iVar1 = Aig_IsComplement(pAVar2);
    if (iVar1 == 0) {
      pAVar2 = Aig_Regular(pAVar2);
      local_38 = (Aig_Obj_t *)(pAVar2->field_5).pData;
    }
    else {
      pAVar2 = Aig_Regular(pAVar2);
      local_38 = Aig_Not((Aig_Obj_t *)(pAVar2->field_5).pData);
    }
    return local_38;
  }
  __assert_fail("!Aig_ObjIsCo(poDriverOld)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/arenaViolation.c"
                ,0x74,"Aig_Obj_t *driverToPoNew(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Obj_t *driverToPoNew( Aig_Man_t *pAig, Aig_Obj_t *pObjPo )
{
    Aig_Obj_t *poDriverOld;
    Aig_Obj_t *poDriverNew;    
    
    //Aig_ObjPrint( pAig, pObjPo );
    //printf("\n");

    assert( Aig_ObjIsCo(pObjPo) );
    poDriverOld = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
    assert( !Aig_ObjIsCo(poDriverOld) );
    poDriverNew = !Aig_IsComplement(poDriverOld)? 
            (Aig_Obj_t *)(Aig_Regular(poDriverOld)->pData) : 
            Aig_Not((Aig_Obj_t *)(Aig_Regular(poDriverOld)->pData));
    //assert( !Aig_ObjIsCo(poDriverNew) );
    return poDriverNew;
}